

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O0

void __thiscall
siamese::RecoveryPacketList::Insert
          (RecoveryPacketList *this,RecoveryPacket *recovery,bool outOfOrder)

{
  byte in_DL;
  undefined8 *in_RSI;
  long in_RDI;
  uint prevEnd;
  uint prevStart;
  uint recoveryEnd;
  uint recoveryStart;
  RecoveryPacket *next;
  RecoveryPacket *prev;
  long *local_38;
  long *local_30;
  
  local_30 = *(long **)(in_RDI + 0x18);
  local_38 = (long *)0x0;
  for (; local_30 != (long *)0x0; local_30 = (long *)local_30[1]) {
    if ((*(uint *)((long)local_30 + 0x24) <= *(uint *)((long)in_RSI + 0x24)) &&
       ((*(uint *)((long)local_30 + 0x24) < *(uint *)((long)in_RSI + 0x24) ||
        (0x1fffff < (*(int *)((long)in_RSI + 0x14) - *(int *)((long)local_30 + 0x14) & 0x3fffffU))))
       ) break;
    local_38 = local_30;
  }
  *in_RSI = local_38;
  in_RSI[1] = local_30;
  if (local_30 == (long *)0x0) {
    *(undefined8 **)(in_RDI + 0x10) = in_RSI;
  }
  else {
    *local_30 = (long)in_RSI;
  }
  if (local_38 == (long *)0x0) {
    *(undefined8 **)(in_RDI + 0x18) = in_RSI;
  }
  else {
    local_38[1] = (long)in_RSI;
  }
  if ((local_30 == (long *)0x0) || (local_38 != (long *)0x0)) {
    CheckedRegionState::Reset((CheckedRegionState *)0x23a3e2);
  }
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
  if ((in_DL & 1) == 0) {
    *(undefined8 *)(in_RDI + 0x24) = in_RSI[2];
    *(undefined8 *)(in_RDI + 0x2c) = in_RSI[3];
    *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RSI + 7);
  }
  return;
}

Assistant:

void RecoveryPacketList::Insert(RecoveryPacket* recovery, bool outOfOrder)
{
    RecoveryPacket* prev = Tail;
    RecoveryPacket* next = nullptr;

    const unsigned recoveryStart = recovery->Metadata.ColumnStart;
    const unsigned recoveryEnd   = recovery->ElementEnd;

    // Search for insertion point:
    for (; prev; next = prev, prev = prev->Prev)
    {
        const unsigned prevStart = prev->Metadata.ColumnStart;
        const unsigned prevEnd   = prev->ElementEnd;

        /*
            This insertion order guarantees that the left and right side of
            the recovery input ranges are monotonically increasing as in:

                recovery 0: 012345
                recovery 1:   23456 <- Cauchy row
                recovery 2: 01234567
                recovery 3:     45678
                recovery 4:     456789
        */
        if (recoveryEnd >= prevEnd)
        {
            if (recoveryEnd > prevEnd) {
                break;
            }
            if (IsColumnDeltaNegative(SubtractColumns(recoveryStart, prevStart))) {
                break;
            }
        }
    }

    // Insert into linked list
    recovery->Next = next;
    recovery->Prev = prev;
    if (prev) {
        prev->Next = recovery;
    }
    else {
        Head = recovery;
    }
    if (next) {
        next->Prev = recovery;
    }
    else {
        Tail = recovery;
    }

    // If inserting at head or somewhere in the middle:
    // Invalidate the checked region because a smaller solution may be available
    if (!prev || next) {
        CheckedRegion->Reset();
    }
    // Note that for the case where we insert at the end of a non-empty list we do
    // not reset the checked region.  This is the common case where recovery data is
    // received in order.

    ++RecoveryPacketCount;

    if (!outOfOrder)
    {
        // Update the last received recovery metadata
        LastRecoveryMetadata = recovery->Metadata;
        LastRecoveryBytes = recovery->Buffer.Bytes;
    }
}